

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommonTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmCommonTargetGenerator::AddFortranFlags(cmCommonTargetGenerator *this,string *flags)

{
  cmMakefile *pcVar1;
  cmGeneratorTarget *target;
  cmLocalCommonGenerator *this_00;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  reference source;
  string local_238;
  allocator local_211;
  string local_210 [8];
  string flg;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  const_iterator idi;
  string local_1d0;
  allocator local_1aa;
  allocator local_1a9;
  string local_1a8;
  string local_188;
  string *local_168;
  string *config;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string local_140;
  char *local_120;
  char *modpath_flag;
  string local_110 [8];
  string modflag;
  string local_e8;
  char *local_c8;
  char *moddir_flag;
  string local_b8;
  string local_98;
  undefined1 local_78 [8];
  string mod_dir;
  allocator local_41;
  string local_40;
  char *local_20;
  char *modout_flag;
  string *flags_local;
  cmCommonTargetGenerator *this_local;
  
  pcVar1 = this->Makefile;
  modout_flag = (char *)flags;
  flags_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"CMAKE_Fortran_MODOUT_FLAG",&local_41);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_20 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[6])
              (this->LocalGenerator,modout_flag,pcVar3);
  }
  GetFortranModuleDirectory_abi_cxx11_((string *)local_78,this);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    Convert(&local_98,this,(string *)local_78,this->WorkingDirectory,SHELL);
    std::__cxx11::string::operator=((string *)local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_b8,"CMAKE_Fortran_MODDIR_DEFAULT",
               (allocator *)((long)&moddir_flag + 7));
    pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_b8);
    std::__cxx11::string::operator=((string *)local_78,pcVar3);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&moddir_flag + 7));
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_e8,"CMAKE_Fortran_MODDIR_FLAG",
               (allocator *)(modflag.field_2._M_local_buf + 0xf));
    pcVar3 = cmMakefile::GetRequiredDefinition(pcVar1,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator((allocator<char> *)(modflag.field_2._M_local_buf + 0xf));
    local_c8 = pcVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,pcVar3,(allocator *)((long)&modpath_flag + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&modpath_flag + 7));
    std::__cxx11::string::operator+=(local_110,(string *)local_78);
    (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
              (this->LocalGenerator,modout_flag,local_110);
    std::__cxx11::string::~string(local_110);
  }
  pcVar1 = this->Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_140,"CMAKE_Fortran_MODPATH_FLAG",
             (allocator *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&includes.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_120 = pcVar3;
  if (pcVar3 != (char *)0x0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&config);
    pcVar1 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a8,"CMAKE_BUILD_TYPE",&local_1a9);
    pcVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_1a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_188,pcVar3,&local_1aa);
    std::allocator<char>::~allocator((allocator<char> *)&local_1aa);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    local_168 = &local_188;
    target = this->GeneratorTarget;
    this_00 = this->LocalGenerator;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d0,"C",(allocator *)((long)&idi._M_current + 7));
    cmLocalGenerator::GetIncludeDirectories
              (&this_00->super_cmLocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&config,target,&local_1d0,local_168,true);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&idi._M_current + 7));
    local_1e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1e0,&local_1e8);
    while( true ) {
      flg.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&config);
      bVar2 = __gnu_cxx::operator!=
                        (&local_1e0,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&flg.field_2 + 8));
      pcVar3 = local_120;
      if (!bVar2) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_210,pcVar3,&local_211);
      std::allocator<char>::~allocator((allocator<char> *)&local_211);
      source = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_1e0);
      Convert(&local_238,this,source,NONE,SHELL);
      std::__cxx11::string::operator+=(local_210,(string *)&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      (*(this->LocalGenerator->super_cmLocalGenerator)._vptr_cmLocalGenerator[5])
                (this->LocalGenerator,modout_flag,local_210);
      std::__cxx11::string::~string(local_210);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_1e0);
    }
    std::__cxx11::string::~string((string *)&local_188);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&config);
  }
  std::__cxx11::string::~string((string *)local_78);
  return;
}

Assistant:

void cmCommonTargetGenerator::AddFortranFlags(std::string& flags)
{
  // Enable module output if necessary.
  if(const char* modout_flag =
     this->Makefile->GetDefinition("CMAKE_Fortran_MODOUT_FLAG"))
    {
    this->LocalGenerator->AppendFlags(flags, modout_flag);
    }

  // Add a module output directory flag if necessary.
  std::string mod_dir = this->GetFortranModuleDirectory();
  if (!mod_dir.empty())
    {
    mod_dir = this->Convert(mod_dir,
                            this->WorkingDirectory,
                            cmLocalGenerator::SHELL);
    }
  else
    {
    mod_dir =
      this->Makefile->GetSafeDefinition("CMAKE_Fortran_MODDIR_DEFAULT");
    }
  if (!mod_dir.empty())
    {
    const char* moddir_flag =
      this->Makefile->GetRequiredDefinition("CMAKE_Fortran_MODDIR_FLAG");
    std::string modflag = moddir_flag;
    modflag += mod_dir;
    this->LocalGenerator->AppendFlags(flags, modflag);
    }

  // If there is a separate module path flag then duplicate the
  // include path with it.  This compiler does not search the include
  // path for modules.
  if(const char* modpath_flag =
     this->Makefile->GetDefinition("CMAKE_Fortran_MODPATH_FLAG"))
    {
    std::vector<std::string> includes;
    const std::string& config =
      this->Makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
    this->LocalGenerator->GetIncludeDirectories(includes,
                                                this->GeneratorTarget,
                                                "C", config);
    for(std::vector<std::string>::const_iterator idi = includes.begin();
        idi != includes.end(); ++idi)
      {
      std::string flg = modpath_flag;
      flg += this->Convert(*idi,
                           cmLocalGenerator::NONE,
                           cmLocalGenerator::SHELL);
      this->LocalGenerator->AppendFlags(flags, flg);
      }
    }
}